

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerializedPipelineStateImpl.cpp
# Opt level: O2

void __thiscall
Diligent::SerializedPipelineStateImpl::
SerializedPipelineStateImpl<Diligent::GraphicsPipelineStateCreateInfo>
          (SerializedPipelineStateImpl *this,IReferenceCounters *pRefCounters,
          SerializationDeviceImpl *pDevice,GraphicsPipelineStateCreateInfo *CreateInfo,
          PipelineStateArchiveInfo *ArchiveInfo)

{
  undefined1 uVar1;
  undefined2 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  Char *pCVar5;
  IThreadPool *pThreadPool;
  RefCntAutoPtr<Diligent::IAsyncTask> __p;
  pointer pSVar6;
  pointer ppSVar7;
  pointer ppSVar8;
  SerializedShaderStageInfo *Stage;
  pointer pSVar9;
  pointer ppSVar10;
  char *pcVar11;
  SerializedPipelineStateImpl *AutoPtr;
  RefCntAutoPtr<Diligent::IAsyncTask> pCompileTask;
  vector<Diligent::SerializedShaderStageInfo,_std::allocator<Diligent::SerializedShaderStageInfo>_>
  ShaderStages;
  vector<const_Diligent::SerializedShaderImpl_*,_std::allocator<const_Diligent::SerializedShaderImpl_*>_>
  Shaders;
  SHADER_TYPE ActiveShaderStages;
  vector<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>_>_>
  ShaderCompileTasks;
  anon_class_736_4_c7ef5757_for_Handler local_318;
  
  ObjectBase<Diligent::ISerializedPipelineState>::ObjectBase
            (&this->super_ObjectBase<Diligent::ISerializedPipelineState>,pRefCounters);
  (this->super_ObjectBase<Diligent::ISerializedPipelineState>).
  super_RefCountedObject<Diligent::ISerializedPipelineState>.super_ISerializedPipelineState.
  super_IPipelineState.super_IDeviceObject.super_IObject._vptr_IObject =
       (_func_int **)&PTR_QueryInterface_00a4e548;
  this->m_pSerializationDevice = pDevice;
  (this->m_Data).Aux.NoShaderReflection = false;
  memset(&(this->m_Data).Common,0,0xc9);
  pCVar5 = (CreateInfo->super_PipelineStateCreateInfo).PSODesc.super_DeviceObjectAttribs.Name;
  pcVar11 = "";
  if (pCVar5 != (Char *)0x0) {
    pcVar11 = pCVar5;
  }
  std::__cxx11::string::string((string *)&this->m_Name,pcVar11,(allocator *)&local_318);
  local_318.this =
       *(SerializedPipelineStateImpl **)
        &(CreateInfo->super_PipelineStateCreateInfo).PSODesc.PipelineType;
  local_318.Shaders.
  super__Vector_base<const_Diligent::SerializedShaderImpl_*,_std::allocator<const_Diligent::SerializedShaderImpl_*>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)(CreateInfo->super_PipelineStateCreateInfo).PSODesc.ImmediateContextMask;
  uVar1 = (CreateInfo->super_PipelineStateCreateInfo).PSODesc.ResourceLayout.field_0x3;
  uVar2 = *(undefined2 *)
           &(CreateInfo->super_PipelineStateCreateInfo).PSODesc.ResourceLayout.field_0x1;
  ShaderStages.
  super__Vector_base<Diligent::SerializedShaderStageInfo,_std::allocator<Diligent::SerializedShaderStageInfo>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT62(CONCAT51(ShaderStages.
                                  super__Vector_base<Diligent::SerializedShaderStageInfo,_std::allocator<Diligent::SerializedShaderStageInfo>_>
                                  ._M_impl.super__Vector_impl_data._M_start._3_5_,uVar1),uVar2);
  uVar3 = *(undefined4 *)
           &(CreateInfo->super_PipelineStateCreateInfo).PSODesc.ResourceLayout.field_0xc;
  uVar4 = *(undefined4 *)
           &(CreateInfo->super_PipelineStateCreateInfo).PSODesc.ResourceLayout.field_0x1c;
  (this->m_Desc).super_DeviceObjectAttribs.Name = (this->m_Name)._M_dataplus._M_p;
  *(SerializedPipelineStateImpl **)&(this->m_Desc).PipelineType = local_318.this;
  (this->m_Desc).ImmediateContextMask =
       (Uint64)local_318.Shaders.
               super__Vector_base<const_Diligent::SerializedShaderImpl_*,_std::allocator<const_Diligent::SerializedShaderImpl_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
  (this->m_Desc).ResourceLayout.DefaultVariableType = SHADER_RESOURCE_VARIABLE_TYPE_STATIC;
  (this->m_Desc).ResourceLayout.field_0x3 = uVar1;
  *(undefined2 *)&(this->m_Desc).ResourceLayout.field_0x1 = uVar2;
  (this->m_Desc).ResourceLayout.DefaultVariableMergeStages = SHADER_TYPE_UNKNOWN;
  (this->m_Desc).ResourceLayout.NumVariables = 0;
  *(undefined4 *)&(this->m_Desc).ResourceLayout.field_0xc = uVar3;
  (this->m_Desc).ResourceLayout.Variables = (ShaderResourceVariableDesc *)0x0;
  (this->m_Desc).ResourceLayout.NumImmutableSamplers = 0;
  *(undefined4 *)&(this->m_Desc).ResourceLayout.field_0x1c = uVar4;
  (this->m_Desc).ResourceLayout.ImmutableSamplers = (ImmutableSamplerDesc *)0x0;
  RefCntAutoPtr<Diligent::IRenderPass>::RefCntAutoPtr
            (&this->m_pRenderPass,(CreateInfo->GraphicsPipeline).pRenderPass);
  (this->m_AsyncInitializer)._M_t.
  super___uniq_ptr_impl<Diligent::AsyncInitializer,_std::default_delete<Diligent::AsyncInitializer>_>
  ._M_t.
  super__Tuple_impl<0UL,_Diligent::AsyncInitializer_*,_std::default_delete<Diligent::AsyncInitializer>_>
  .super__Head_base<0UL,_Diligent::AsyncInitializer_*,_false>._M_head_impl = (AsyncInitializer *)0x0
  ;
  (this->m_Status)._M_i = PIPELINE_STATE_STATUS_UNINITIALIZED;
  (this->m_pDefaultSignature).m_pObject = (SerializedResourceSignatureImpl *)0x0;
  (this->m_Signatures).
  super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IPipelineResourceSignature>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IPipelineResourceSignature>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_Signatures).
  super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IPipelineResourceSignature>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IPipelineResourceSignature>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_Signatures).
  super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IPipelineResourceSignature>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IPipelineResourceSignature>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar11 = (CreateInfo->super_PipelineStateCreateInfo).PSODesc.super_DeviceObjectAttribs.Name;
  if ((pcVar11 == (char *)0x0) || (*pcVar11 == '\0')) {
    LogError<true,char[54]>
              (false,"SerializedPipelineStateImpl",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/SerializedPipelineStateImpl.cpp"
               ,0x173,(char (*) [54])"Serialized pipeline state name can\'t be null or empty");
  }
  anon_unknown_126::ValidatePipelineStateArchiveInfo
            (&CreateInfo->super_PipelineStateCreateInfo,ArchiveInfo,pDevice->m_ValidDeviceFlags);
  ValidatePSOCreateInfo<Diligent::GraphicsPipelineStateCreateInfo>
            ((IRenderDevice *)pDevice,CreateInfo);
  LOCK();
  (this->m_Status)._M_i = PIPELINE_STATE_STATUS_COMPILING;
  UNLOCK();
  if ((((CreateInfo->super_PipelineStateCreateInfo).Flags & PSO_CREATE_FLAG_ASYNCHRONOUS) ==
       PSO_CREATE_FLAG_NONE) ||
     ((pDevice->super_RenderDeviceBase<Diligent::SerializationEngineImplTraits>).
      m_pShaderCompilationThreadPool.m_pObject == (IThreadPool *)0x0)) {
    Initialize<Diligent::GraphicsPipelineStateCreateInfo>(this,CreateInfo,ArchiveInfo);
    LOCK();
    (this->m_Status)._M_i = PIPELINE_STATE_STATUS_READY;
    UNLOCK();
  }
  else {
    ShaderStages.
    super__Vector_base<Diligent::SerializedShaderStageInfo,_std::allocator<Diligent::SerializedShaderStageInfo>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ShaderStages.
    super__Vector_base<Diligent::SerializedShaderStageInfo,_std::allocator<Diligent::SerializedShaderStageInfo>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    ShaderStages.
    super__Vector_base<Diligent::SerializedShaderStageInfo,_std::allocator<Diligent::SerializedShaderStageInfo>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ActiveShaderStages = SHADER_TYPE_UNKNOWN;
    PipelineStateUtils::
    ExtractShaders<Diligent::SerializedShaderImpl,std::vector<Diligent::SerializedShaderStageInfo,std::allocator<Diligent::SerializedShaderStageInfo>>>
              (CreateInfo,&ShaderStages,false,&ActiveShaderStages);
    pSVar6 = ShaderStages.
             super__Vector_base<Diligent::SerializedShaderStageInfo,_std::allocator<Diligent::SerializedShaderStageInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    Shaders.
    super__Vector_base<const_Diligent::SerializedShaderImpl_*,_std::allocator<const_Diligent::SerializedShaderImpl_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    Shaders.
    super__Vector_base<const_Diligent::SerializedShaderImpl_*,_std::allocator<const_Diligent::SerializedShaderImpl_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    Shaders.
    super__Vector_base<const_Diligent::SerializedShaderImpl_*,_std::allocator<const_Diligent::SerializedShaderImpl_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    for (pSVar9 = ShaderStages.
                  super__Vector_base<Diligent::SerializedShaderStageInfo,_std::allocator<Diligent::SerializedShaderStageInfo>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppSVar7 = Shaders.
                  super__Vector_base<const_Diligent::SerializedShaderImpl_*,_std::allocator<const_Diligent::SerializedShaderImpl_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish, pSVar9 != pSVar6; pSVar9 = pSVar9 + 1)
    {
      std::
      vector<Diligent::SerializedShaderImpl_const*,std::allocator<Diligent::SerializedShaderImpl_const*>>
      ::
      insert<__gnu_cxx::__normal_iterator<Diligent::SerializedShaderImpl_const*const*,std::vector<Diligent::SerializedShaderImpl_const*,std::allocator<Diligent::SerializedShaderImpl_const*>>>,void>
                ((vector<Diligent::SerializedShaderImpl_const*,std::allocator<Diligent::SerializedShaderImpl_const*>>
                  *)&Shaders,
                 (const_iterator)
                 Shaders.
                 super__Vector_base<const_Diligent::SerializedShaderImpl_*,_std::allocator<const_Diligent::SerializedShaderImpl_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
                 (__normal_iterator<const_Diligent::SerializedShaderImpl_*const_*,_std::vector<const_Diligent::SerializedShaderImpl_*,_std::allocator<const_Diligent::SerializedShaderImpl_*>_>_>
                  )(pSVar9->Shaders).
                   super__Vector_base<const_Diligent::SerializedShaderImpl_*,_std::allocator<const_Diligent::SerializedShaderImpl_*>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                 (__normal_iterator<const_Diligent::SerializedShaderImpl_*const_*,_std::vector<const_Diligent::SerializedShaderImpl_*,_std::allocator<const_Diligent::SerializedShaderImpl_*>_>_>
                  )(pSVar9->Shaders).
                   super__Vector_base<const_Diligent::SerializedShaderImpl_*,_std::allocator<const_Diligent::SerializedShaderImpl_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
    }
    ShaderCompileTasks.
    super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ShaderCompileTasks.
    super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    ShaderCompileTasks.
    super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    for (ppSVar10 = Shaders.
                    super__Vector_base<const_Diligent::SerializedShaderImpl_*,_std::allocator<const_Diligent::SerializedShaderImpl_*>_>
                    ._M_impl.super__Vector_impl_data._M_start; ppSVar10 != ppSVar7;
        ppSVar10 = ppSVar10 + 1) {
      SerializedShaderImpl::GetCompileTasks
                ((vector<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>_>_>
                  *)&local_318,*ppSVar10);
      ppSVar8 = local_318.Shaders.
                super__Vector_base<const_Diligent::SerializedShaderImpl_*,_std::allocator<const_Diligent::SerializedShaderImpl_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      for (AutoPtr = local_318.this; AutoPtr != (SerializedPipelineStateImpl *)ppSVar8;
          AutoPtr = (SerializedPipelineStateImpl *)
                    &(AutoPtr->super_ObjectBase<Diligent::ISerializedPipelineState>).
                     super_RefCountedObject<Diligent::ISerializedPipelineState>.m_pRefCounters) {
        RefCntAutoPtr<Diligent::IAsyncTask>::RefCntAutoPtr
                  (&pCompileTask,(RefCntAutoPtr<Diligent::IAsyncTask> *)AutoPtr);
        std::
        vector<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>,std::allocator<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>>>
        ::emplace_back<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>>
                  ((vector<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>,std::allocator<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>>>
                    *)&ShaderCompileTasks,&pCompileTask);
        RefCntAutoPtr<Diligent::IAsyncTask>::Release(&pCompileTask);
      }
      std::
      vector<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>_>_>
      ::~vector((vector<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>_>_>
                 *)&local_318);
    }
    pThreadPool = (pDevice->super_RenderDeviceBase<Diligent::SerializationEngineImplTraits>).
                  m_pShaderCompilationThreadPool.m_pObject;
    local_318.this = this;
    std::
    vector<const_Diligent::SerializedShaderImpl_*,_std::allocator<const_Diligent::SerializedShaderImpl_*>_>
    ::vector(&local_318.Shaders,&Shaders);
    GraphicsPipelineStateCreateInfoX::GraphicsPipelineStateCreateInfoX
              (&local_318.CreateInfo,CreateInfo);
    local_318.ArchiveInfo = *ArchiveInfo;
    AsyncInitializer::
    Start<Diligent::SerializedPipelineStateImpl::SerializedPipelineStateImpl<Diligent::GraphicsPipelineStateCreateInfo>(Diligent::IReferenceCounters*,Diligent::SerializationDeviceImpl*,Diligent::GraphicsPipelineStateCreateInfo_const&,Diligent::PipelineStateArchiveInfo_const&)::_lambda(unsigned_int)_1_>
              ((AsyncInitializer *)&pCompileTask,pThreadPool,&ShaderCompileTasks,&local_318);
    __p = pCompileTask;
    pCompileTask.m_pObject = (IAsyncTask *)0x0;
    std::
    __uniq_ptr_impl<Diligent::AsyncInitializer,_std::default_delete<Diligent::AsyncInitializer>_>::
    reset((__uniq_ptr_impl<Diligent::AsyncInitializer,_std::default_delete<Diligent::AsyncInitializer>_>
           *)&this->m_AsyncInitializer,(pointer)__p.m_pObject);
    std::unique_ptr<Diligent::AsyncInitializer,_std::default_delete<Diligent::AsyncInitializer>_>::
    ~unique_ptr((unique_ptr<Diligent::AsyncInitializer,_std::default_delete<Diligent::AsyncInitializer>_>
                 *)&pCompileTask);
    SerializedPipelineStateImpl<Diligent::GraphicsPipelineStateCreateInfo>(Diligent::IReferenceCounters*,Diligent::SerializationDeviceImpl*,Diligent::GraphicsPipelineStateCreateInfo_const&,Diligent::PipelineStateArchiveInfo_const&)
    ::{lambda(unsigned_int)#1}::~PipelineStateArchiveInfo((_lambda_unsigned_int__1_ *)&local_318);
    std::
    vector<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>_>_>
    ::~vector(&ShaderCompileTasks);
    std::
    _Vector_base<const_Diligent::SerializedShaderImpl_*,_std::allocator<const_Diligent::SerializedShaderImpl_*>_>
    ::~_Vector_base(&Shaders.
                     super__Vector_base<const_Diligent::SerializedShaderImpl_*,_std::allocator<const_Diligent::SerializedShaderImpl_*>_>
                   );
    std::
    vector<Diligent::SerializedShaderStageInfo,_std::allocator<Diligent::SerializedShaderStageInfo>_>
    ::~vector(&ShaderStages);
  }
  return;
}

Assistant:

SerializedPipelineStateImpl::SerializedPipelineStateImpl(IReferenceCounters*             pRefCounters,
                                                         SerializationDeviceImpl*        pDevice,
                                                         const PSOCreateInfoType&        CreateInfo,
                                                         const PipelineStateArchiveInfo& ArchiveInfo) :
    TBase{pRefCounters},
    m_pSerializationDevice{pDevice},
    m_Name{CreateInfo.PSODesc.Name != nullptr ? CreateInfo.PSODesc.Name : ""},
    m_Desc //
    {
        [this](PipelineStateDesc Desc) //
        {
            Desc.Name = m_Name.c_str();
            // We don't need resource layout and we don't copy variables and immutable samplers
            Desc.ResourceLayout = {};
            return Desc;
        }(CreateInfo.PSODesc) //
    },
    m_pRenderPass{RenderPassFromCI(CreateInfo)}
{
    if (CreateInfo.PSODesc.Name == nullptr || CreateInfo.PSODesc.Name[0] == '\0')
        LOG_ERROR_AND_THROW("Serialized pipeline state name can't be null or empty");

    ValidatePipelineStateArchiveInfo(CreateInfo, ArchiveInfo, pDevice->GetSupportedDeviceFlags());
    ValidatePSOCreateInfo(pDevice, CreateInfo);

    m_Status.store(PIPELINE_STATE_STATUS_COMPILING);
    if ((CreateInfo.Flags & PSO_CREATE_FLAG_ASYNCHRONOUS) != 0 && pDevice->GetShaderCompilationThreadPool() != nullptr)
    {
        // Collect all asynchronous shader compile tasks
        std::vector<SerializedShaderStageInfo> ShaderStages;
        SHADER_TYPE                            ActiveShaderStages    = SHADER_TYPE_UNKNOWN;
        constexpr bool                         WaitUntilShadersReady = false;
        PipelineStateUtils::ExtractShaders<SerializedShaderImpl>(CreateInfo, ShaderStages, WaitUntilShadersReady, ActiveShaderStages);

        std::vector<const SerializedShaderImpl*> Shaders;
        for (const SerializedShaderStageInfo& Stage : ShaderStages)
        {
            Shaders.insert(Shaders.end(), Stage.Shaders.begin(), Stage.Shaders.end());
        }

        std::vector<RefCntAutoPtr<IAsyncTask>> ShaderCompileTasks;
        for (const SerializedShaderImpl* pShader : Shaders)
        {
            for (RefCntAutoPtr<IAsyncTask> pCompileTask : pShader->GetCompileTasks())
                ShaderCompileTasks.emplace_back(std::move(pCompileTask));
        }

        m_AsyncInitializer = AsyncInitializer::Start(
            pDevice->GetShaderCompilationThreadPool(),
            ShaderCompileTasks, // Make sure that all asynchronous shader compile tasks are completed first
            [this,
#ifdef DILIGENT_DEBUG
             Shaders,
#endif
             CreateInfo = typename PipelineStateCreateInfoXTraits<PSOCreateInfoType>::CreateInfoXType{CreateInfo},
             ArchiveInfo](Uint32 ThreadId) mutable //
            {
#ifdef DILIGENT_DEBUG
                for (const SerializedShaderImpl* pShader : Shaders)
                {
                    VERIFY(!pShader->IsCompiling(), "All shader compile tasks must have been completed since we used them as "
                                                    "prerequisites for the pipeline initialization task. This appears to be a bug.");
                }
#endif
                try
                {
                    Initialize(static_cast<const PSOCreateInfoType&>(CreateInfo), ArchiveInfo);
                    m_Status.store(PIPELINE_STATE_STATUS_READY);
                }
                catch (...)
                {
                    m_Status.store(PIPELINE_STATE_STATUS_FAILED);
                }

                // Release create info objects
                CreateInfo.Clear();
            });
    }
    else
    {
        Initialize(static_cast<const PSOCreateInfoType&>(CreateInfo), ArchiveInfo);
        m_Status.store(PIPELINE_STATE_STATUS_READY);
    }
}